

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseIncoming.cpp
# Opt level: O2

Result __thiscall tonk::SessionIncoming::attemptDecode(SessionIncoming *this)

{
  uchar *puVar1;
  ostringstream *poVar2;
  SiameseResult SVar3;
  OutputWorker *pOVar4;
  RefCounter *pRVar5;
  Result *success;
  SiameseOriginalPacket *in_RSI;
  uint i;
  ulong uVar6;
  undefined1 auVar7 [64];
  undefined1 auVar8 [16];
  undefined1 auVar9 [64];
  undefined1 auVar10 [16];
  uint recoveredOriginalCount;
  SessionIncoming *local_228;
  SiameseOriginalPacket *recoveredOriginals;
  uint64_t stats [11];
  undefined1 local_1c0 [8];
  LogStringBuffer local_1b8;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  local_228 = this;
  do {
    SVar3 = siamese_decoder_is_ready((SiameseDecoder)in_RSI[0x26].Data);
    if (SVar3 != Siamese_Success) {
      if (SVar3 == Siamese_NeedMoreData) {
LAB_001519b3:
        (this->Deps).ConnectionRef = (RefCounter *)0x0;
      }
      else {
        std::__cxx11::string::string
                  ((string *)(local_1c0 + 8),"siamese_decoder_is_ready failed",(allocator *)stats);
        pRVar5 = (RefCounter *)operator_new(0x38);
        *(char **)pRVar5 = "SessionIncoming::decoderAddOriginal";
        std::__cxx11::string::string((string *)&pRVar5->ShutdownJson,(string *)(local_1c0 + 8));
        (pRVar5->RefCount).super___atomic_base<int>._M_i = 1;
        (this->Deps).ConnectionRef = pRVar5;
        *(long *)&(pRVar5->ShutdownLock).super___mutex_base._M_mutex = (long)(int)SVar3;
        std::__cxx11::string::~string((string *)(local_1c0 + 8));
        puVar1 = in_RSI[2].Data;
        Result::ToJson_abi_cxx11_((string *)stats,(Result *)this);
        if (*(int *)(puVar1 + 8) < 5) {
          local_1b8.ChannelName = *(char **)puVar1;
          poVar2 = &local_1b8.LogStream;
          local_1b8.LogLevel = Error;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
          std::operator<<((ostream *)poVar2,(string *)(puVar1 + 0x38));
          std::operator<<((ostream *)poVar2,"siamese_decoder_is_ready failed: ");
          std::operator<<((ostream *)poVar2,(string *)stats);
          pOVar4 = logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(pOVar4,(LogStringBuffer *)(local_1c0 + 8));
LAB_00151a94:
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b8.LogStream);
        }
LAB_00151a9c:
        std::__cxx11::string::~string((string *)stats);
      }
      return (Result)(ErrorResult *)this;
    }
    recoveredOriginals = (SiameseOriginalPacket *)0x0;
    recoveredOriginalCount = 0;
    SVar3 = siamese_decode((SiameseDecoder)in_RSI[0x26].Data,&recoveredOriginals,
                           &recoveredOriginalCount);
    for (uVar6 = 0; this = local_228, uVar6 < recoveredOriginalCount; uVar6 = uVar6 + 1) {
      onSiameseSolved((SessionIncoming *)local_1c0,in_RSI);
      Result::~Result((Result *)local_1c0);
    }
    if (SVar3 != Siamese_Success) {
      if (SVar3 == Siamese_NeedMoreData) {
        siamese_decoder_stats((SiameseDecoder)in_RSI[0x26].Data,stats,0xb);
        puVar1 = in_RSI[2].Data;
        if (*(int *)(puVar1 + 8) < 2) {
          local_1b8.ChannelName = *(char **)puVar1;
          poVar2 = &local_1b8.LogStream;
          local_1b8.LogLevel = Debug;
          auVar10 = std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
          auVar9._0_8_ = auVar10._8_8_;
          auVar7._0_8_ = auVar10._0_8_;
          auVar9._8_56_ = extraout_var_00;
          auVar8 = auVar9._0_16_;
          auVar7._8_56_ = extraout_var;
          auVar10 = auVar7._0_16_;
          std::operator<<((ostream *)poVar2,(string *)(puVar1 + 0x38));
          std::operator<<((ostream *)poVar2,
                          "Recovery failed and needs more data (rare): Failure rate = ");
          auVar10 = vcvtusi2ss_avx512f(auVar10,stats[8]);
          auVar8 = vcvtusi2ss_avx512f(auVar8,stats[7] + stats[8]);
          std::ostream::operator<<
                    ((ostream *)poVar2,
                     (float)((uint)(stats[8] != 0) * (int)(auVar10._0_4_ / auVar8._0_4_)));
          std::operator<<((ostream *)poVar2," solveFailCount=");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
          std::operator<<((ostream *)poVar2," successCount = ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
          pOVar4 = logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(pOVar4,(LogStringBuffer *)(local_1c0 + 8));
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar2);
        }
        goto LAB_001519b3;
      }
      std::__cxx11::string::string
                ((string *)(local_1c0 + 8),"siamese_decode failed",(allocator *)stats);
      pRVar5 = (RefCounter *)operator_new(0x38);
      *(char **)pRVar5 = "SessionIncoming::decoderAddOriginal";
      std::__cxx11::string::string((string *)&pRVar5->ShutdownJson,(string *)(local_1c0 + 8));
      (pRVar5->RefCount).super___atomic_base<int>._M_i = 1;
      (this->Deps).ConnectionRef = pRVar5;
      *(long *)&(pRVar5->ShutdownLock).super___mutex_base._M_mutex = (long)(int)SVar3;
      std::__cxx11::string::~string((string *)(local_1c0 + 8));
      puVar1 = in_RSI[2].Data;
      Result::ToJson_abi_cxx11_((string *)stats,(Result *)this);
      if (4 < *(int *)(puVar1 + 8)) goto LAB_00151a9c;
      local_1b8.ChannelName = *(char **)puVar1;
      poVar2 = &local_1b8.LogStream;
      local_1b8.LogLevel = Error;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
      std::operator<<((ostream *)poVar2,(string *)(puVar1 + 0x38));
      std::operator<<((ostream *)poVar2,"siamese_decode failed: ");
      std::operator<<((ostream *)poVar2,(string *)stats);
      pOVar4 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar4,(LogStringBuffer *)(local_1c0 + 8));
      goto LAB_00151a94;
    }
    resumeProcessing(local_228);
    if ((this->Deps).ConnectionRef != (RefCounter *)0x0) {
      return (Result)(ErrorResult *)this;
    }
    Result::~Result((Result *)this);
  } while( true );
}

Assistant:

Result SessionIncoming::attemptDecode()
{
    // Run decode loop
    for (;;)
    {
        // Check if decoder is ready
        const int readyResult = siamese_decoder_is_ready(FECDecoder);

        if (readyResult == Siamese_NeedMoreData) {
            break;
        }

        if (readyResult != Siamese_Success)
        {
            Result result = Result("SessionIncoming::decoderAddOriginal", "siamese_decoder_is_ready failed", ErrorType::Siamese, readyResult);
            Deps.Logger->Error("siamese_decoder_is_ready failed: ", result.ToJson());
            return result;
        }

        SiameseOriginalPacket* recoveredOriginals = nullptr;
        unsigned recoveredOriginalCount = 0;

        // Attempt to decode
        const int decodeResult = siamese_decode(FECDecoder, &recoveredOriginals, &recoveredOriginalCount);

        // Handle any Unordered/Unreliable messages as they are decoded
        for (unsigned i = 0; i < recoveredOriginalCount; ++i) {
            onSiameseSolved(recoveredOriginals[i]);
        }

        if (decodeResult == Siamese_NeedMoreData)
        {
            uint64_t stats[SiameseDecoderStats_Count];
            siamese_decoder_stats(FECDecoder, stats, SiameseDecoderStats_Count);

            uint64_t solveFailCount = stats[SiameseDecoderStats_SolveFailCount];
            uint64_t successCount = stats[SiameseDecoderStats_SolveSuccessCount];

            float failRate = 0.f;
            if (solveFailCount > 0) {
                failRate = solveFailCount / (float)(solveFailCount + successCount);
            }
            Deps.Logger->Debug("Recovery failed and needs more data (rare): Failure rate = ", failRate, " solveFailCount=", solveFailCount, " successCount = ", successCount);

            break;
        }

        if (decodeResult != Siamese_Success)
        {
            Result result = Result("SessionIncoming::decoderAddOriginal", "siamese_decode failed", ErrorType::Siamese, decodeResult);
            Deps.Logger->Error("siamese_decode failed: ", result.ToJson());
            return result;
        }

        //Deps.Logger->Debug("SIAMESE RECOVERED: ", recoveredOriginalCount);

        // Resume processing
        Result result = resumeProcessing();
        if (result.IsFail()) {
            return result;
        }
    }

    return Result::Success();
}